

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ProcessRTCPSenderInfo
          (RTPSources *this,uint32_t ssrc,RTPNTPTime *ntptime,uint32_t rtptime,uint32_t packetcount,
          uint32_t octetcount,RTPTime *receivetime,RTPAddress *senderaddress)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  undefined3 uVar8;
  int iVar9;
  bool local_39;
  RTPInternalSourceData *local_38;
  
  iVar9 = GetRTCPSourceData(this,ssrc,senderaddress,&local_38,&local_39);
  if (-1 < iVar9) {
    iVar9 = 0;
    if (local_38 != (RTPInternalSourceData *)0x0) {
      bVar7 = (local_38->super_RTPSourceData).SRinf.hasinfo;
      uVar8 = *(undefined3 *)&(local_38->super_RTPSourceData).SRinf.field_0x1;
      uVar1 = (local_38->super_RTPSourceData).SRinf.ntptimestamp.msw;
      uVar2 = (local_38->super_RTPSourceData).SRinf.ntptimestamp.lsw;
      uVar3 = (local_38->super_RTPSourceData).SRinf.rtptimestamp;
      uVar4 = (local_38->super_RTPSourceData).SRinf.bytecount;
      uVar5 = *(undefined4 *)&(local_38->super_RTPSourceData).SRinf.receivetime.m_t;
      uVar6 = *(undefined4 *)((long)&(local_38->super_RTPSourceData).SRinf.receivetime.m_t + 4);
      (local_38->super_RTPSourceData).SRprevinf.packetcount =
           (local_38->super_RTPSourceData).SRinf.packetcount;
      (local_38->super_RTPSourceData).SRprevinf.bytecount = uVar4;
      *(undefined4 *)&(local_38->super_RTPSourceData).SRprevinf.receivetime.m_t = uVar5;
      *(undefined4 *)((long)&(local_38->super_RTPSourceData).SRprevinf.receivetime.m_t + 4) = uVar6;
      (local_38->super_RTPSourceData).SRprevinf.hasinfo = bVar7;
      *(undefined3 *)&(local_38->super_RTPSourceData).SRprevinf.field_0x1 = uVar8;
      (local_38->super_RTPSourceData).SRprevinf.ntptimestamp.msw = uVar1;
      (local_38->super_RTPSourceData).SRprevinf.ntptimestamp.lsw = uVar2;
      (local_38->super_RTPSourceData).SRprevinf.rtptimestamp = uVar3;
      (local_38->super_RTPSourceData).SRinf.ntptimestamp = *ntptime;
      (local_38->super_RTPSourceData).SRinf.rtptimestamp = rtptime;
      (local_38->super_RTPSourceData).SRinf.packetcount = packetcount;
      (local_38->super_RTPSourceData).SRinf.bytecount = octetcount;
      (local_38->super_RTPSourceData).SRinf.receivetime.m_t = receivetime->m_t;
      (local_38->super_RTPSourceData).SRinf.hasinfo = true;
      (local_38->super_RTPSourceData).stats.lastmsgtime.m_t = receivetime->m_t;
      if (local_39 == true) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_38);
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xb])(this,local_38);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int RTPSources::ProcessRTCPSenderInfo(uint32_t ssrc,const RTPNTPTime &ntptime,uint32_t rtptime,
                          uint32_t packetcount,uint32_t octetcount,const RTPTime &receivetime,
			  const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	srcdat->ProcessSenderInfo(ntptime,rtptime,packetcount,octetcount,receivetime);
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);

	OnRTCPSenderReport(srcdat);

	return 0;
}